

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffload.c
# Opt level: O3

FT_Error cff_vstore_load(CFF_VStoreRec *vstore,FT_Stream stream,FT_ULong base_offset,FT_ULong offset
                        )

{
  FT_Memory memory;
  FT_UShort FVar1;
  FT_UShort FVar2;
  FT_UShort FVar3;
  FT_ULong FVar4;
  FT_ULong FVar5;
  FT_Pointer P;
  FT_ULong FVar6;
  CFF_VarRegion *pCVar7;
  CFF_AxisCoords *pCVar8;
  CFF_VarData *pCVar9;
  FT_UInt *pFVar10;
  ulong uVar11;
  long lVar12;
  ulong local_58;
  ulong local_50;
  ulong local_40;
  FT_Error local_34;
  
  memory = stream->memory;
  if (offset == 0) {
    P = (FT_Pointer)0x0;
LAB_001fee3f:
    local_34 = 0;
  }
  else {
    local_34 = FT_Stream_Seek(stream,offset + base_offset);
    if ((local_34 == 0) && (local_34 = FT_Stream_Skip(stream,2), local_34 == 0)) {
      FVar4 = FT_Stream_Pos(stream);
      FVar1 = FT_Stream_ReadUShort(stream,&local_34);
      if (local_34 == 0) {
        if (FVar1 == 1) {
          FVar5 = FT_Stream_ReadULong(stream,&local_34);
          if (local_34 == 0) {
            FVar1 = FT_Stream_ReadUShort(stream,&local_34);
            vstore->dataCount = (uint)FVar1;
            if (local_34 == 0) {
              P = ft_mem_realloc(memory,8,0,(ulong)FVar1,(void *)0x0,&local_34);
              if (local_34 != 0) goto LAB_001fee52;
              if (vstore->dataCount != 0) {
                uVar11 = 0;
                do {
                  FVar6 = FT_Stream_ReadULong(stream,&local_34);
                  *(FT_ULong *)((long)P + uVar11 * 8) = FVar6;
                  if (local_34 != 0) goto LAB_001fee52;
                  uVar11 = uVar11 + 1;
                } while (uVar11 < vstore->dataCount);
              }
              local_34 = FT_Stream_Seek(stream,FVar5 + (FVar4 & 0xffffffff));
              if (local_34 != 0) goto LAB_001fee52;
              FVar1 = FT_Stream_ReadUShort(stream,&local_34);
              vstore->axisCount = FVar1;
              if (local_34 != 0) goto LAB_001fee52;
              FVar1 = FT_Stream_ReadUShort(stream,&local_34);
              vstore->regionCount = (uint)FVar1;
              if (local_34 != 0) goto LAB_001fee52;
              pCVar7 = (CFF_VarRegion *)
                       ft_mem_realloc(memory,8,0,(ulong)FVar1,(void *)0x0,&local_34);
              vstore->varRegionList = pCVar7;
              if (local_34 != 0) goto LAB_001fee52;
              if (vstore->regionCount != 0) {
                uVar11 = (ulong)vstore->axisCount;
                local_58 = 0;
                do {
                  pCVar7 = vstore->varRegionList;
                  pCVar8 = (CFF_AxisCoords *)
                           ft_mem_realloc(memory,0x18,0,uVar11,(void *)0x0,&local_34);
                  pCVar7[local_58].axisList = pCVar8;
                  if (local_34 != 0) goto LAB_001fee52;
                  if (vstore->axisCount == 0) {
                    uVar11 = 0;
                  }
                  else {
                    lVar12 = 0x10;
                    local_40 = 0;
                    do {
                      pCVar8 = pCVar7[local_58].axisList;
                      FVar1 = FT_Stream_ReadUShort(stream,&local_34);
                      if (((local_34 != 0) ||
                          (FVar2 = FT_Stream_ReadUShort(stream,&local_34), local_34 != 0)) ||
                         (FVar3 = FT_Stream_ReadUShort(stream,&local_34), local_34 != 0))
                      goto LAB_001fee52;
                      *(long *)((long)pCVar8 + lVar12 + -0x10) = (long)(short)FVar1 << 2;
                      *(long *)((long)pCVar8 + lVar12 + -8) = (long)(short)FVar2 << 2;
                      *(long *)((long)&pCVar8->startCoord + lVar12) = (long)(short)FVar3 << 2;
                      local_40 = local_40 + 1;
                      uVar11 = (ulong)vstore->axisCount;
                      lVar12 = lVar12 + 0x18;
                    } while (local_40 < uVar11);
                  }
                  local_58 = local_58 + 1;
                } while (local_58 < vstore->regionCount);
              }
              pCVar9 = (CFF_VarData *)
                       ft_mem_realloc(memory,0x10,0,(ulong)vstore->dataCount,(void *)0x0,&local_34);
              vstore->varData = pCVar9;
              if (local_34 != 0) goto LAB_001fee52;
              if (vstore->dataCount != 0) {
                local_50 = 0;
                do {
                  pCVar9 = vstore->varData + local_50;
                  local_34 = FT_Stream_Seek(stream,*(long *)((long)P + local_50 * 8) +
                                                   (FVar4 & 0xffffffff));
                  if ((local_34 != 0) || (local_34 = FT_Stream_Skip(stream,4), local_34 != 0))
                  goto LAB_001fee52;
                  FVar1 = FT_Stream_ReadUShort(stream,&local_34);
                  pCVar9->regionIdxCount = (uint)FVar1;
                  if (local_34 != 0) goto LAB_001fee52;
                  pFVar10 = (FT_UInt *)ft_mem_realloc(memory,4,0,(ulong)FVar1,(void *)0x0,&local_34)
                  ;
                  pCVar9->regionIndices = pFVar10;
                  if (local_34 != 0) goto LAB_001fee52;
                  if (pCVar9->regionIdxCount != 0) {
                    uVar11 = 0;
                    do {
                      FVar1 = FT_Stream_ReadUShort(stream,&local_34);
                      pCVar9->regionIndices[uVar11] = (uint)FVar1;
                      if (local_34 != 0) goto LAB_001fee52;
                      uVar11 = uVar11 + 1;
                    } while (uVar11 < pCVar9->regionIdxCount);
                  }
                  local_50 = local_50 + 1;
                } while (local_50 < vstore->dataCount);
              }
              goto LAB_001fee3f;
            }
          }
        }
        else {
          local_34 = 3;
        }
      }
    }
    P = (void *)0x0;
  }
LAB_001fee52:
  ft_mem_free(memory,P);
  if (local_34 == 0) {
    local_34 = 0;
  }
  else {
    cff_vstore_done(vstore,memory);
  }
  return local_34;
}

Assistant:

static FT_Error
  cff_vstore_load( CFF_VStoreRec*  vstore,
                   FT_Stream       stream,
                   FT_ULong        base_offset,
                   FT_ULong        offset )
  {
    FT_Memory  memory = stream->memory;
    FT_Error   error  = FT_ERR( Invalid_File_Format );

    FT_ULong*  dataOffsetArray = NULL;
    FT_UInt    i, j;


    /* no offset means no vstore to parse */
    if ( offset )
    {
      FT_UInt   vsOffset;
      FT_UInt   format;
      FT_ULong  regionListOffset;


      /* we need to parse the table to determine its size; */
      /* skip table length                                 */
      if ( FT_STREAM_SEEK( base_offset + offset ) ||
           FT_STREAM_SKIP( 2 )                    )
        goto Exit;

      /* actual variation store begins after the length */
      vsOffset = FT_STREAM_POS();

      /* check the header */
      if ( FT_READ_USHORT( format ) )
        goto Exit;
      if ( format != 1 )
      {
        error = FT_THROW( Invalid_File_Format );
        goto Exit;
      }

      /* read top level fields */
      if ( FT_READ_ULONG( regionListOffset )   ||
           FT_READ_USHORT( vstore->dataCount ) )
        goto Exit;

      /* make temporary copy of item variation data offsets; */
      /* we'll parse region list first, then come back       */
      if ( FT_NEW_ARRAY( dataOffsetArray, vstore->dataCount ) )
        goto Exit;

      for ( i = 0; i < vstore->dataCount; i++ )
      {
        if ( FT_READ_ULONG( dataOffsetArray[i] ) )
          goto Exit;
      }

      /* parse regionList and axisLists */
      if ( FT_STREAM_SEEK( vsOffset + regionListOffset ) ||
           FT_READ_USHORT( vstore->axisCount )           ||
           FT_READ_USHORT( vstore->regionCount )         )
        goto Exit;

      if ( FT_NEW_ARRAY( vstore->varRegionList, vstore->regionCount ) )
        goto Exit;

      for ( i = 0; i < vstore->regionCount; i++ )
      {
        CFF_VarRegion*  region = &vstore->varRegionList[i];


        if ( FT_NEW_ARRAY( region->axisList, vstore->axisCount ) )
          goto Exit;

        for ( j = 0; j < vstore->axisCount; j++ )
        {
          CFF_AxisCoords*  axis = &region->axisList[j];

          FT_Int16  start14, peak14, end14;


          if ( FT_READ_SHORT( start14 ) ||
               FT_READ_SHORT( peak14 )  ||
               FT_READ_SHORT( end14 )   )
            goto Exit;

          axis->startCoord = FT_fdot14ToFixed( start14 );
          axis->peakCoord  = FT_fdot14ToFixed( peak14 );
          axis->endCoord   = FT_fdot14ToFixed( end14 );
        }
      }

      /* use dataOffsetArray now to parse varData items */
      if ( FT_NEW_ARRAY( vstore->varData, vstore->dataCount ) )
        goto Exit;

      for ( i = 0; i < vstore->dataCount; i++ )
      {
        CFF_VarData*  data = &vstore->varData[i];


        if ( FT_STREAM_SEEK( vsOffset + dataOffsetArray[i] ) )
          goto Exit;

        /* ignore `itemCount' and `shortDeltaCount' */
        /* because CFF2 has no delta sets           */
        if ( FT_STREAM_SKIP( 4 ) )
          goto Exit;

        /* Note: just record values; consistency is checked later    */
        /*       by cff_blend_build_vector when it consumes `vstore' */

        if ( FT_READ_USHORT( data->regionIdxCount ) )
          goto Exit;

        if ( FT_NEW_ARRAY( data->regionIndices, data->regionIdxCount ) )
          goto Exit;

        for ( j = 0; j < data->regionIdxCount; j++ )
        {
          if ( FT_READ_USHORT( data->regionIndices[j] ) )
            goto Exit;
        }
      }
    }

    error = FT_Err_Ok;

  Exit:
    FT_FREE( dataOffsetArray );
    if ( error )
      cff_vstore_done( vstore, memory );

    return error;
  }